

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilut.h
# Opt level: O0

void Mini_LutGrow(Mini_Lut_t *p,int nCapMin)

{
  uint *__ptr;
  int iVar1;
  uint *local_28;
  int *local_20;
  int nCapMin_local;
  Mini_Lut_t *p_local;
  
  if (p->nCap < nCapMin) {
    if (p->pArray == (int *)0x0) {
      local_20 = (int *)malloc((long)(nCapMin * p->LutSize) << 2);
    }
    else {
      local_20 = (int *)realloc(p->pArray,(long)(nCapMin * p->LutSize) << 2);
    }
    p->pArray = local_20;
    if (p->pTruths == (uint *)0x0) {
      iVar1 = Mini_LutWordNum(p->LutSize);
      local_28 = (uint *)malloc((long)(nCapMin * iVar1) << 2);
    }
    else {
      __ptr = p->pTruths;
      iVar1 = Mini_LutWordNum(p->LutSize);
      local_28 = (uint *)realloc(__ptr,(long)(nCapMin * iVar1) << 2);
    }
    p->pTruths = local_28;
    p->nCap = nCapMin;
    if (p->pArray == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/miniaig/minilut.h"
                    ,0x55,"void Mini_LutGrow(Mini_Lut_t *, int)");
    }
    if (p->pTruths == (uint *)0x0) {
      __assert_fail("p->pTruths",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/miniaig/minilut.h"
                    ,0x56,"void Mini_LutGrow(Mini_Lut_t *, int)");
    }
  }
  return;
}

Assistant:

static void Mini_LutGrow( Mini_Lut_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    p->pArray  = MINI_LUT_REALLOC( int,      p->pArray,  nCapMin * p->LutSize ); 
    p->pTruths = MINI_LUT_REALLOC( unsigned, p->pTruths, nCapMin * Mini_LutWordNum(p->LutSize) ); 
    p->nCap   = nCapMin;
    assert( p->pArray );
    assert( p->pTruths );
}